

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O1

void VP8IteratorNzToBytes(VP8EncIterator *it)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = it->nz[-1];
  uVar2 = *it->nz;
  it->top_nz[0] = uVar2 >> 0xc & 1;
  it->top_nz[1] = uVar2 >> 0xd & 1;
  it->top_nz[2] = uVar2 >> 0xe & 1;
  it->top_nz[3] = uVar2 >> 0xf & 1;
  it->top_nz[4] = uVar2 >> 0x12 & 1;
  it->top_nz[5] = uVar2 >> 0x13 & 1;
  it->top_nz[6] = uVar2 >> 0x16 & 1;
  it->top_nz[7] = uVar2 >> 0x17 & 1;
  it->top_nz[8] = uVar2 >> 0x18 & 1;
  it->left_nz[0] = uVar1 >> 3 & 1;
  it->left_nz[1] = uVar1 >> 7 & 1;
  it->left_nz[2] = uVar1 >> 0xb & 1;
  it->left_nz[3] = uVar1 >> 0xf & 1;
  it->left_nz[4] = uVar1 >> 0x11 & 1;
  it->left_nz[5] = uVar1 >> 0x13 & 1;
  it->left_nz[6] = uVar1 >> 0x15 & 1;
  it->left_nz[7] = uVar1 >> 0x17 & 1;
  return;
}

Assistant:

void VP8IteratorNzToBytes(VP8EncIterator* const it) {
  const int tnz = it->nz[0], lnz = it->nz[-1];
  int* const top_nz = it->top_nz;
  int* const left_nz = it->left_nz;

  // Top-Y
  top_nz[0] = BIT(tnz, 12);
  top_nz[1] = BIT(tnz, 13);
  top_nz[2] = BIT(tnz, 14);
  top_nz[3] = BIT(tnz, 15);
  // Top-U
  top_nz[4] = BIT(tnz, 18);
  top_nz[5] = BIT(tnz, 19);
  // Top-V
  top_nz[6] = BIT(tnz, 22);
  top_nz[7] = BIT(tnz, 23);
  // DC
  top_nz[8] = BIT(tnz, 24);

  // left-Y
  left_nz[0] = BIT(lnz,  3);
  left_nz[1] = BIT(lnz,  7);
  left_nz[2] = BIT(lnz, 11);
  left_nz[3] = BIT(lnz, 15);
  // left-U
  left_nz[4] = BIT(lnz, 17);
  left_nz[5] = BIT(lnz, 19);
  // left-V
  left_nz[6] = BIT(lnz, 21);
  left_nz[7] = BIT(lnz, 23);
  // left-DC is special, iterated separately
}